

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForService
          (Generator *this,ServiceDescriptor *service_descriptor)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long local_110;
  string method_options;
  string service_options;
  string descriptor_name;
  string method_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ModuleLevelServiceDescriptorName_abi_cxx11_(&descriptor_name,this,service_descriptor);
  MessageLite::SerializeAsString_abi_cxx11_
            (&method_options,*(MessageLite **)(service_descriptor + 0x18));
  OptionsValue(&service_options,this,&method_options);
  std::__cxx11::string::~string((string *)&method_options);
  bVar2 = std::operator!=(&service_options,"None");
  if (bVar2) {
    anon_unknown_0::PrintDescriptorOptionsFixingCode
              (&descriptor_name,&service_options,this->printer_);
  }
  local_110 = 0x38;
  for (lVar3 = 0; lVar3 < *(int *)(service_descriptor + 0x28); lVar3 = lVar3 + 1) {
    lVar1 = *(long *)(service_descriptor + 0x20);
    MessageLite::SerializeAsString_abi_cxx11_(&method_name,*(MessageLite **)(lVar1 + local_110));
    OptionsValue(&method_options,this,&method_name);
    std::__cxx11::string::~string((string *)&method_name);
    bVar2 = std::operator!=(&method_options,"None");
    if (bVar2) {
      std::operator+(&local_70,&descriptor_name,".methods_by_name[\'");
      std::operator+(&local_50,&local_70,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (lVar1 + -0x30 + local_110));
      std::operator+(&method_name,&local_50,"\']");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      anon_unknown_0::PrintDescriptorOptionsFixingCode(&method_name,&method_options,this->printer_);
      std::__cxx11::string::~string((string *)&method_name);
    }
    std::__cxx11::string::~string((string *)&method_options);
    local_110 = local_110 + 0x40;
  }
  std::__cxx11::string::~string((string *)&service_options);
  std::__cxx11::string::~string((string *)&descriptor_name);
  return;
}

Assistant:

void Generator::FixOptionsForService(
    const ServiceDescriptor& service_descriptor) const {
  std::string descriptor_name =
      ModuleLevelServiceDescriptorName(service_descriptor);
  std::string service_options =
      OptionsValue(service_descriptor.options().SerializeAsString());
  if (service_options != "None") {
    PrintDescriptorOptionsFixingCode(descriptor_name, service_options,
                                     printer_);
  }

  for (int i = 0; i < service_descriptor.method_count(); ++i) {
    const MethodDescriptor* method = service_descriptor.method(i);
    std::string method_options =
        OptionsValue(method->options().SerializeAsString());
    if (method_options != "None") {
      std::string method_name =
          descriptor_name + ".methods_by_name['" + method->name() + "']";
      PrintDescriptorOptionsFixingCode(method_name, method_options, printer_);
    }
  }
}